

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::CompMatFuncBase<4,_2>::doApply
          (IRet *__return_storage_ptr__,CompMatFuncBase<4,_2> *this,EvalContext *ctx,IArgs *iargs)

{
  bool *pbVar1;
  long *plVar2;
  IArgs *pIVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  undefined1 local_6e;
  undefined1 local_6d;
  uint local_6c;
  bool *local_68;
  bool *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  double dStack_40;
  undefined8 local_38;
  
  pIVar3 = iargs;
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix(__return_storage_ptr__);
  uVar4 = CONCAT71((int7)((ulong)pIVar3 >> 8),1);
  lVar6 = 0;
  do {
    local_6c = (uint)uVar4;
    lVar6 = lVar6 * 0x60;
    lVar5 = 4;
    do {
      plVar2 = (long *)(**(code **)(*(long *)this + 0x58))(this);
      local_68 = &(iargs->a->m_data).m_data[0].m_data[0].m_hasNaN + lVar6;
      local_60 = &(iargs->b->m_data).m_data[0].m_data[0].m_hasNaN + lVar6;
      local_58 = &local_6d;
      local_50 = &local_6e;
      (**(code **)(*plVar2 + 0x40))(&local_48,plVar2,ctx,&local_68);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_data).m_data[0].m_data[0].m_hi + lVar6) =
           local_38;
      pbVar1 = &(__return_storage_ptr__->m_data).m_data[0].m_data[0].m_hasNaN + lVar6;
      *(undefined8 *)pbVar1 = local_48;
      *(double *)(pbVar1 + 8) = dStack_40;
      lVar6 = lVar6 + 0x18;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    lVar6 = 1;
    uVar4 = 0;
  } while ((local_6c & 1) != 0);
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply	(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet			ret;

		for (int col = 0; col < Cols; ++col)
		{
			for (int row = 0; row < Rows; ++row)
				ret[col][row] = this->doGetScalarFunc().apply(ctx,
															  iargs.a[col][row],
															  iargs.b[col][row]);
		}

		return ret;
	}